

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O1

vector<CBlockHeader,_std::allocator<CBlockHeader>_> * __thiscall
HeadersSyncState::PopHeadersReadyForAcceptance
          (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *__return_storage_ptr__,
          HeadersSyncState *this)

{
  undefined4 uVar1;
  _Map_pointer ppCVar2;
  _Elt_pointer pCVar3;
  undefined4 uVar4;
  iterator __position;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  long lVar10;
  CBlockHeader *pCVar11;
  iterator iVar12;
  long in_FS_OFFSET;
  byte bVar13;
  CBlockHeader ret;
  CBlockHeader local_88;
  long local_38;
  
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_download_state == REDOWNLOAD) {
    while( true ) {
      ppCVar2 = (this->m_redownloaded_headers).
                super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      pCVar3 = (this->m_redownloaded_headers).
               super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      uVar9 = ((long)(this->m_redownloaded_headers).
                     super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                     super__Deque_impl_data._M_start._M_last - (long)pCVar3 >> 4) *
              -0x5555555555555555 +
              ((long)(this->m_redownloaded_headers).
                     super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur -
               (long)(this->m_redownloaded_headers).
                     super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
              (((long)ppCVar2 -
                (long)(this->m_redownloaded_headers).
                      super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl
                      .super__Deque_impl_data._M_start._M_node >> 3) + -1 +
              (ulong)(ppCVar2 == (_Map_pointer)0x0)) * 10;
      if ((uVar9 < 0x391e) && ((uVar9 == 0 || (this->m_process_all_remaining_headers != true))))
      break;
      local_88.nVersion = pCVar3->nVersion;
      uVar5 = *(undefined8 *)
               (this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               8);
      uVar7 = *(undefined8 *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               0x10);
      uVar8 = *(undefined8 *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               0x18);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._16_4_ = SUB84(uVar7,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_4_ =
           SUB84((ulong)uVar7 >> 0x20,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._24_4_ = SUB84(uVar8,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._28_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._0_4_ = SUB84(uVar5,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_4_ =
           SUB84((ulong)uVar5 >> 0x20,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._8_4_ = SUB84(uVar6,0);
      local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_4_ =
           SUB84((ulong)uVar6 >> 0x20,0);
      uVar5 = *(undefined8 *)(pCVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems;
      uVar6 = *(undefined8 *)((pCVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8);
      uVar7 = *(undefined8 *)((pCVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10)
      ;
      uVar8 = *(undefined8 *)((pCVar3->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18)
      ;
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_4_ = SUB84(uVar7,0);
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._20_4_ =
           SUB84((ulong)uVar7 >> 0x20,0);
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_4_ = SUB84(uVar8,0);
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._28_4_ =
           SUB84((ulong)uVar8 >> 0x20,0);
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_4_ = SUB84(uVar5,0);
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._4_4_ =
           SUB84((ulong)uVar5 >> 0x20,0);
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_4_ = SUB84(uVar6,0);
      local_88.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._12_4_ =
           SUB84((ulong)uVar6 >> 0x20,0);
      uVar1 = pCVar3->nTime;
      uVar4 = pCVar3->nBits;
      local_88.nTime = uVar1;
      local_88.nBits = uVar4;
      local_88.nNonce = pCVar3->nNonce;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::_M_realloc_insert<CBlockHeader>
                  (__return_storage_ptr__,__position,&local_88);
      }
      else {
        pCVar11 = &local_88;
        iVar12._M_current = __position._M_current;
        for (lVar10 = 0x14; lVar10 != 0; lVar10 = lVar10 + -1) {
          (iVar12._M_current)->nVersion = pCVar11->nVersion;
          pCVar11 = (CBlockHeader *)((long)pCVar11 + (ulong)bVar13 * -8 + 4);
          iVar12._M_current = iVar12._M_current + (ulong)bVar13 * -8 + 4;
        }
        (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::pop_front
                (&this->m_redownloaded_headers);
      CBlockHeader::GetHash
                ((uint256 *)&local_88,
                 (__return_storage_ptr__->
                 super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_finish + -1);
      *(ulong *)((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
                0x10) =
           CONCAT44(local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._16_4_,
                    local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_4_);
      *(ulong *)((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
                0x18) =
           CONCAT44(local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._24_4_,
                    local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_4_);
      *(int32_t *)(this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems
           = local_88.nVersion;
      *(undefined4 *)
       ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 4) =
           local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._0_4_;
      *(undefined4 *)
       ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 8) =
           local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_4_;
      *(undefined4 *)
       ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0xc) =
           local_88.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._8_4_;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CBlockHeader> HeadersSyncState::PopHeadersReadyForAcceptance()
{
    std::vector<CBlockHeader> ret;

    Assume(m_download_state == State::REDOWNLOAD);
    if (m_download_state != State::REDOWNLOAD) return ret;

    while (m_redownloaded_headers.size() > REDOWNLOAD_BUFFER_SIZE ||
            (m_redownloaded_headers.size() > 0 && m_process_all_remaining_headers)) {
        ret.emplace_back(m_redownloaded_headers.front().GetFullHeader(m_redownload_buffer_first_prev_hash));
        m_redownloaded_headers.pop_front();
        m_redownload_buffer_first_prev_hash = ret.back().GetHash();
    }
    return ret;
}